

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ac78::iDrawQuadrangle
          (anon_unknown_dwarf_1ac78 *this,Vec3 *a,Vec3 *b,Vec3 *c,Vec3 *d,Color *color)

{
  PFNGLCOLOR3FPROC p_Var1;
  int in_EAX;
  int iVar2;
  void *extraout_RDX;
  Vec3 *pVVar3;
  Vec3 *pVVar4;
  int iVar5;
  GLfloat extraout_XMM0_Da;
  float fVar6;
  float fVar7;
  
  iVar5 = (int)color;
  iVar2 = (int)c;
  pVVar3 = a;
  pVVar4 = d;
  OpenSteer::warnIfInUpdatePhase("iDrawQuadrangle");
  p_Var1 = glad_glColor3f;
  OpenSteer::Color::r((Color *)d,pVVar3,extraout_RDX,iVar2,(char *)pVVar4,iVar5,in_EAX);
  fVar6 = OpenSteer::Color::g((Color *)d);
  fVar7 = OpenSteer::Color::b((Color *)d);
  (*p_Var1)(extraout_XMM0_Da,fVar6,fVar7);
  (*glad_glBegin)(7);
  iglVertexVec3((Vec3 *)this);
  iglVertexVec3(a);
  iglVertexVec3(b);
  iglVertexVec3(c);
  (*glad_glEnd)();
  return;
}

Assistant:

inline void iDrawQuadrangle (const OpenSteer::Vec3& a,
                                 const OpenSteer::Vec3& b,
                                 const OpenSteer::Vec3& c,
                                 const OpenSteer::Vec3& d,
                                 const OpenSteer::Color& color)
    {
        OpenSteer::warnIfInUpdatePhase ("iDrawQuadrangle");
        glColor3f (color.r(), color.g(), color.b());
        glBegin (GL_QUADS);
        {
            OpenSteer::glVertexVec3 (a);
            OpenSteer::glVertexVec3 (b);
            OpenSteer::glVertexVec3 (c);
            OpenSteer::glVertexVec3 (d);
        }
        glEnd ();
    }